

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_32e0b::CleanTestCleanRsp::Run(CleanTestCleanRsp *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  TimeStamp TVar6;
  allocator<char> local_3b9;
  string local_3b8;
  allocator<char> local_391;
  string local_390;
  allocator<char> local_369;
  string local_368;
  allocator<char> local_341;
  string local_340;
  allocator<char> local_319;
  string local_318;
  allocator<char> local_2f1;
  string local_2f0;
  undefined1 local_2d0 [8];
  string err;
  undefined1 local_2a8 [8];
  Cleaner cleaner;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  allocator<char> local_1b9;
  string local_1b8;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  allocator<char> local_141;
  string local_140;
  allocator<char> local_119;
  string local_118;
  allocator<char> local_f1;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  ManifestParserOptions local_1c;
  int local_14;
  CleanTestCleanRsp *pCStack_10;
  int fail_count;
  CleanTestCleanRsp *this_local;
  
  pCStack_10 = this;
  local_14 = testing::Test::AssertionFailures(g_current_test);
  ManifestParserOptions::ManifestParserOptions(&local_1c);
  AssertParse(&(this->super_CleanTest).super_StateTestWithBuiltinRules.state_,
              "rule cat_rsp \n  command = cat $rspfile > $out\n  rspfile = $rspfile\n  rspfile_content = $in\nbuild in1: cat src1\nbuild out1: cat in1\nbuild in2: cat_rsp src2\n  rspfile=in2.rsp\nbuild out2: cat_rsp in2\n  rspfile=out2.rsp\n"
              ,local_1c);
  iVar4 = local_14;
  iVar3 = testing::Test::AssertionFailures(g_current_test);
  if (iVar4 == iVar3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"in1",&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"",&local_79);
    VirtualFileSystem::Create(&(this->super_CleanTest).fs_,&local_40,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"out1",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"",&local_c9);
    VirtualFileSystem::Create(&(this->super_CleanTest).fs_,&local_a0,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator(&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"in2.rsp",&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"",&local_119);
    VirtualFileSystem::Create(&(this->super_CleanTest).fs_,&local_f0,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    std::__cxx11::string::~string((string *)&local_f0);
    std::allocator<char>::~allocator(&local_f1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"out2.rsp",&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"",&local_169);
    VirtualFileSystem::Create(&(this->super_CleanTest).fs_,&local_140,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
    std::__cxx11::string::~string((string *)&local_140);
    std::allocator<char>::~allocator(&local_141);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"in2",&local_191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"",&local_1b9);
    VirtualFileSystem::Create(&(this->super_CleanTest).fs_,&local_190,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::allocator<char>::~allocator(&local_1b9);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator(&local_191);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"out2",&local_1e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_208,"",(allocator<char> *)&cleaner.field_0x97);
    VirtualFileSystem::Create(&(this->super_CleanTest).fs_,&local_1e0,&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::allocator<char>::~allocator((allocator<char> *)&cleaner.field_0x97);
    std::__cxx11::string::~string((string *)&local_1e0);
    std::allocator<char>::~allocator(&local_1e1);
    Cleaner::Cleaner((Cleaner *)local_2a8,
                     &(this->super_CleanTest).super_StateTestWithBuiltinRules.state_,
                     &(this->super_CleanTest).config_,
                     &(this->super_CleanTest).fs_.super_DiskInterface);
    pTVar1 = g_current_test;
    iVar4 = Cleaner::cleaned_files_count((Cleaner *)local_2a8);
    bVar2 = testing::Test::Check
                      (pTVar1,iVar4 == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                       ,0x182,"0 == cleaner.cleaned_files_count()");
    pTVar1 = g_current_test;
    if (bVar2) {
      iVar4 = Cleaner::CleanTarget((Cleaner *)local_2a8,"out1");
      bVar2 = testing::Test::Check
                        (pTVar1,iVar4 == 0,
                         "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                         ,0x183,"0 == cleaner.CleanTarget(\"out1\")");
      pTVar1 = g_current_test;
      if (bVar2) {
        iVar4 = Cleaner::cleaned_files_count((Cleaner *)local_2a8);
        testing::Test::Check
                  (pTVar1,iVar4 == 2,
                   "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                   ,0x184,"2 == cleaner.cleaned_files_count()");
        pTVar1 = g_current_test;
        iVar4 = Cleaner::CleanTarget((Cleaner *)local_2a8,"in2");
        bVar2 = testing::Test::Check
                          (pTVar1,iVar4 == 0,
                           "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                           ,0x185,"0 == cleaner.CleanTarget(\"in2\")");
        pTVar1 = g_current_test;
        if (bVar2) {
          iVar4 = Cleaner::cleaned_files_count((Cleaner *)local_2a8);
          testing::Test::Check
                    (pTVar1,iVar4 == 2,
                     "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                     ,0x186,"2 == cleaner.cleaned_files_count()");
          pTVar1 = g_current_test;
          iVar4 = Cleaner::CleanRule((Cleaner *)local_2a8,"cat_rsp");
          bVar2 = testing::Test::Check
                            (pTVar1,iVar4 == 0,
                             "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                             ,0x187,"0 == cleaner.CleanRule(\"cat_rsp\")");
          pTVar1 = g_current_test;
          if (bVar2) {
            iVar4 = Cleaner::cleaned_files_count((Cleaner *)local_2a8);
            testing::Test::Check
                      (pTVar1,iVar4 == 2,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                       ,0x188,"2 == cleaner.cleaned_files_count()");
            pTVar1 = g_current_test;
            sVar5 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size(&(this->super_CleanTest).fs_.files_removed_);
            testing::Test::Check
                      (pTVar1,sVar5 == 6,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                       ,0x18a,"6u == fs_.files_removed_.size()");
            std::__cxx11::string::string((string *)local_2d0);
            pTVar1 = g_current_test;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_2f0,"in1",&local_2f1);
            TVar6 = VirtualFileSystem::Stat
                              (&(this->super_CleanTest).fs_,&local_2f0,(string *)local_2d0);
            testing::Test::Check
                      (pTVar1,TVar6 == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                       ,0x18e,"0 == fs_.Stat(\"in1\", &err)");
            std::__cxx11::string::~string((string *)&local_2f0);
            std::allocator<char>::~allocator(&local_2f1);
            pTVar1 = g_current_test;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_318,"out1",&local_319);
            TVar6 = VirtualFileSystem::Stat
                              (&(this->super_CleanTest).fs_,&local_318,(string *)local_2d0);
            testing::Test::Check
                      (pTVar1,TVar6 == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                       ,399,"0 == fs_.Stat(\"out1\", &err)");
            std::__cxx11::string::~string((string *)&local_318);
            std::allocator<char>::~allocator(&local_319);
            pTVar1 = g_current_test;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_340,"in2",&local_341);
            TVar6 = VirtualFileSystem::Stat
                              (&(this->super_CleanTest).fs_,&local_340,(string *)local_2d0);
            testing::Test::Check
                      (pTVar1,TVar6 == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                       ,400,"0 == fs_.Stat(\"in2\", &err)");
            std::__cxx11::string::~string((string *)&local_340);
            std::allocator<char>::~allocator(&local_341);
            pTVar1 = g_current_test;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_368,"out2",&local_369);
            TVar6 = VirtualFileSystem::Stat
                              (&(this->super_CleanTest).fs_,&local_368,(string *)local_2d0);
            testing::Test::Check
                      (pTVar1,TVar6 == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                       ,0x191,"0 == fs_.Stat(\"out2\", &err)");
            std::__cxx11::string::~string((string *)&local_368);
            std::allocator<char>::~allocator(&local_369);
            pTVar1 = g_current_test;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_390,"in2.rsp",&local_391);
            TVar6 = VirtualFileSystem::Stat
                              (&(this->super_CleanTest).fs_,&local_390,(string *)local_2d0);
            testing::Test::Check
                      (pTVar1,TVar6 == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                       ,0x192,"0 == fs_.Stat(\"in2.rsp\", &err)");
            std::__cxx11::string::~string((string *)&local_390);
            std::allocator<char>::~allocator(&local_391);
            pTVar1 = g_current_test;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_3b8,"out2.rsp",&local_3b9);
            TVar6 = VirtualFileSystem::Stat
                              (&(this->super_CleanTest).fs_,&local_3b8,(string *)local_2d0);
            testing::Test::Check
                      (pTVar1,TVar6 == 0,
                       "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
                       ,0x193,"0 == fs_.Stat(\"out2.rsp\", &err)");
            std::__cxx11::string::~string((string *)&local_3b8);
            std::allocator<char>::~allocator(&local_3b9);
            std::__cxx11::string::~string((string *)local_2d0);
            err.field_2._12_4_ = 0;
          }
          else {
            testing::Test::AddAssertionFailure(g_current_test);
            err.field_2._12_4_ = 1;
          }
        }
        else {
          testing::Test::AddAssertionFailure(g_current_test);
          err.field_2._12_4_ = 1;
        }
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        err.field_2._12_4_ = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      err.field_2._12_4_ = 1;
    }
    Cleaner::~Cleaner((Cleaner *)local_2a8);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
  }
  return;
}

Assistant:

TEST_F(CleanTest, CleanRsp) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cat_rsp \n"
"  command = cat $rspfile > $out\n"
"  rspfile = $rspfile\n"
"  rspfile_content = $in\n"
"build in1: cat src1\n"
"build out1: cat in1\n"
"build in2: cat_rsp src2\n"
"  rspfile=in2.rsp\n"
"build out2: cat_rsp in2\n"
"  rspfile=out2.rsp\n"
));
  fs_.Create("in1", "");
  fs_.Create("out1", "");
  fs_.Create("in2.rsp", "");
  fs_.Create("out2.rsp", "");
  fs_.Create("in2", "");
  fs_.Create("out2", "");

  Cleaner cleaner(&state_, config_, &fs_);
  ASSERT_EQ(0, cleaner.cleaned_files_count());
  ASSERT_EQ(0, cleaner.CleanTarget("out1"));
  EXPECT_EQ(2, cleaner.cleaned_files_count());
  ASSERT_EQ(0, cleaner.CleanTarget("in2"));
  EXPECT_EQ(2, cleaner.cleaned_files_count());
  ASSERT_EQ(0, cleaner.CleanRule("cat_rsp"));
  EXPECT_EQ(2, cleaner.cleaned_files_count());

  EXPECT_EQ(6u, fs_.files_removed_.size());

  // Check they are removed.
  string err;
  EXPECT_EQ(0, fs_.Stat("in1", &err));
  EXPECT_EQ(0, fs_.Stat("out1", &err));
  EXPECT_EQ(0, fs_.Stat("in2", &err));
  EXPECT_EQ(0, fs_.Stat("out2", &err));
  EXPECT_EQ(0, fs_.Stat("in2.rsp", &err));
  EXPECT_EQ(0, fs_.Stat("out2.rsp", &err));
}